

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::ConcurrentAssertionStatementSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ConcurrentAssertionStatementSyntax *this,
          size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  PropertySpecSyntax *node;
  ActionBlockSyntax *node_00;
  SyntaxNode *local_80;
  size_t index_local;
  ConcurrentAssertionStatementSyntax *this_local;
  
  switch(index) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&((this->super_StatementSyntax).label)->super_SyntaxNode);
    break;
  case 1:
    local_80 = (SyntaxNode *)0x0;
    if (this != (ConcurrentAssertionStatementSyntax *)0xffffffffffffffe8) {
      local_80 = &(this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_80);
    break;
  case 2:
    token.kind = (this->keyword).kind;
    token._2_1_ = (this->keyword).field_0x2;
    token.numFlags.raw = (this->keyword).numFlags.raw;
    token.rawLen = (this->keyword).rawLen;
    token.info = (this->keyword).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 3:
    token_00.kind = (this->propertyOrSequence).kind;
    token_00._2_1_ = (this->propertyOrSequence).field_0x2;
    token_00.numFlags.raw = (this->propertyOrSequence).numFlags.raw;
    token_00.rawLen = (this->propertyOrSequence).rawLen;
    token_00.info = (this->propertyOrSequence).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 4:
    token_01.kind = (this->openParen).kind;
    token_01._2_1_ = (this->openParen).field_0x2;
    token_01.numFlags.raw = (this->openParen).numFlags.raw;
    token_01.rawLen = (this->openParen).rawLen;
    token_01.info = (this->openParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 5:
    node = not_null<slang::syntax::PropertySpecSyntax_*>::get(&this->propertySpec);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&node->super_SyntaxNode);
    break;
  case 6:
    token_02.kind = (this->closeParen).kind;
    token_02._2_1_ = (this->closeParen).field_0x2;
    token_02.numFlags.raw = (this->closeParen).numFlags.raw;
    token_02.rawLen = (this->closeParen).rawLen;
    token_02.info = (this->closeParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  case 7:
    node_00 = not_null<slang::syntax::ActionBlockSyntax_*>::get(&this->action);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&node_00->super_SyntaxNode);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ConcurrentAssertionStatementSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return keyword;
        case 3: return propertyOrSequence;
        case 4: return openParen;
        case 5: return propertySpec.get();
        case 6: return closeParen;
        case 7: return action.get();
        default: return nullptr;
    }
}